

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::initialize_logger(registry *this,shared_ptr<spdlog::logger> *new_logger)

{
  pointer pfVar1;
  long in_RDI;
  lock_guard<std::mutex> lock;
  err_handler *in_stack_ffffffffffffff68;
  logger *in_stack_ffffffffffffff70;
  element_type *in_stack_ffffffffffffff78;
  shared_ptr<spdlog::logger> local_60;
  undefined8 in_stack_ffffffffffffffb8;
  registry *in_stack_ffffffffffffffc0;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_ffffffffffffffd8;
  logger *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff70,
             (mutex_type *)in_stack_ffffffffffffff68);
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22c660);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x22c676);
  (*pfVar1->_vptr_formatter[3])(&stack0xffffffffffffffe0);
  logger::set_formatter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             in_stack_ffffffffffffff70);
  if (*(long *)(in_RDI + 0xc0) != 0) {
    in_stack_ffffffffffffff78 =
         std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )0x22c6c1);
    std::function<void(std::__cxx11::string_const&)>::
    function<void(*&)(std::__cxx11::string_const&),void>
              ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&stack0xffffffffffffffb0,
               (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **)
               in_stack_ffffffffffffff78);
    logger::set_error_handler(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x22c6fc);
  }
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22c755);
  logger::set_level(in_stack_ffffffffffffff78,(level_enum)((ulong)in_stack_ffffffffffffff70 >> 0x20)
                   );
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22c774);
  logger::flush_on(in_stack_ffffffffffffff78,(level_enum)((ulong)in_stack_ffffffffffffff70 >> 0x20))
  ;
  if (*(long *)(in_RDI + 0xf8) != 0) {
    std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x22c7a2);
    logger::enable_backtrace(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  }
  if ((*(byte *)(in_RDI + 0xf0) & 1) != 0) {
    std::shared_ptr<spdlog::logger>::shared_ptr
              (&local_60,(shared_ptr<spdlog::logger> *)in_stack_ffffffffffffff68);
    register_logger_(in_stack_ffffffffffffffc0,
                     (shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffb8);
    std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x22c7f7);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x22c820);
  return;
}

Assistant:

SPDLOG_INLINE void registry::initialize_logger(std::shared_ptr<logger> new_logger)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    new_logger->set_formatter(formatter_->clone());

    if (err_handler_)
    {
        new_logger->set_error_handler(err_handler_);
    }

    new_logger->set_level(level_);
    new_logger->flush_on(flush_level_);

    if (backtrace_n_messages_ > 0)
    {
        new_logger->enable_backtrace(backtrace_n_messages_);
    }

    if (automatic_registration_)
    {
        register_logger_(std::move(new_logger));
    }
}